

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_toint(jit_State *J,TRef tr)

{
  uint local_3c;
  TRef tr_local;
  jit_State *J_local;
  
  local_3c = tr;
  if ((tr & 0x1f000000) == 0x4000000) {
    (J->fold).ins.field_0.ot = 0x5e8e;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = 0;
    local_3c = lj_opt_fold(J);
  }
  if ((local_3c & 0x1f000000) == 0xe000000) {
    (J->fold).ins.field_0.ot = 0x5b13;
    (J->fold).ins.field_0.op1 = (IRRef1)local_3c;
    (J->fold).ins.field_0.op2 = 0x126e;
    J_local._4_4_ = lj_opt_fold(J);
  }
  else {
    if (4 < (local_3c >> 0x18 & 0x1f) - 0xf) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    J_local._4_4_ = narrow_stripov(J,local_3c,0x37,0x273);
  }
  return J_local._4_4_;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_toint(jit_State *J, TRef tr)
{
  if (tref_isstr(tr))
    tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
  if (tref_isnum(tr))  /* Conversion may be narrowed, too. See above. */
    return emitir(IRTI(IR_CONV), tr, IRCONV_INT_NUM|IRCONV_ANY);
  if (!tref_isinteger(tr))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  /*
  ** Undefined overflow semantics allow stripping of ADDOV, SUBOV and MULOV.
  ** Use IRCONV_TOBIT for the cache entries, since the semantics are the same.
  */
  return narrow_stripov(J, tr, IR_MULOV, (IRT_INT<<5)|IRT_INT|IRCONV_TOBIT);
}